

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateReader::GetToken
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateReader *this,Index token_index)

{
  size_type sVar1;
  const_reference value;
  CrateReader *this_local;
  Index token_index_local;
  
  sVar1 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_tokens);
  if (token_index.value < sVar1) {
    value = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                      (&this->_tokens,(ulong)token_index.value);
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<const_tinyusdz::Token_&,_0>
              (__return_storage_ptr__,value);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const nonstd::optional<value::token> CrateReader::GetToken(
    crate::Index token_index) const {
  if (token_index.value < _tokens.size()) {
    return _tokens[token_index.value];
  } else {
    return nonstd::nullopt;
  }
}